

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

int __thiscall QWidgetTextControlPrivate::init(QWidgetTextControlPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidgetTextControl *this_00;
  int extraout_EAX;
  QTextDocument *in_RCX;
  QString *in_RDX;
  
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  setContent(this,(TextFormat)ctx,in_RDX,in_RCX);
  QTextDocument::setUndoRedoEnabled(SUB81(this->doc,0));
  QWidgetTextControl::setCursorWidth(this_00,-1);
  return extraout_EAX;
}

Assistant:

void QWidgetTextControlPrivate::init(Qt::TextFormat format, const QString &text, QTextDocument *document)
{
    Q_Q(QWidgetTextControl);
    setContent(format, text, document);

    doc->setUndoRedoEnabled(interactionFlags & Qt::TextEditable);
    q->setCursorWidth(-1);
}